

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O1

void __thiscall ncnn::Einsum::Einsum(Einsum *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Einsum_005e4808;
  (this->lhs_tokens).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lhs_tokens).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lhs_tokens).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rhs_token)._M_dataplus._M_p = (pointer)&(this->rhs_token).field_2;
  (this->rhs_token)._M_string_length = 0;
  (this->rhs_token).field_2._M_local_buf[0] = '\0';
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  return;
}

Assistant:

Einsum::Einsum()
{
    one_blob_only = false;
    support_inplace = false;
}